

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O0

void __thiscall TSMuxer::setMuxFormat(TSMuxer *this,string *format)

{
  bool bVar1;
  uint8_t *puVar2;
  int iVar3;
  bool local_19;
  string *format_local;
  TSMuxer *this_local;
  
  bVar1 = std::operator==(format,"M2TS");
  local_19 = true;
  if (!bVar1) {
    bVar1 = std::operator==(format,"M2T");
    local_19 = true;
    if (!bVar1) {
      bVar1 = std::operator==(format,"MTS");
      local_19 = true;
      if (!bVar1) {
        local_19 = std::operator==(format,"SSIF");
      }
    }
  }
  this->m_m2tsMode = local_19;
  iVar3 = 0x1ffff4;
  if ((this->m_m2tsMode & 1U) != 0) {
    iVar3 = 0x200000;
  }
  this->m_writeBlockSize = iVar3;
  puVar2 = (uint8_t *)operator_new__((long)(this->m_writeBlockSize + 0x400));
  this->m_outBuf = puVar2;
  iVar3 = 0xbc;
  if ((this->m_m2tsMode & 1U) != 0) {
    iVar3 = 0xc0;
  }
  this->m_frameSize = iVar3;
  if ((this->m_m2tsMode & 1U) != 0) {
    (this->super_AbstractMuxer).m_sectorSize = 0x1800;
  }
  return;
}

Assistant:

void TSMuxer::setMuxFormat(const std::string& format)
{
    m_m2tsMode = format == "M2TS" || format == "M2T" || format == "MTS" || format == "SSIF";
    m_writeBlockSize = m_m2tsMode ? DEFAULT_FILE_BLOCK_SIZE : TS188_ROUND_BLOCK_SIZE;
    m_outBuf = new uint8_t[m_writeBlockSize + 1024];
    m_frameSize = m_m2tsMode ? 192 : 188;
    if (m_m2tsMode)
        m_sectorSize = 1024 * 6;
}